

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

Optional<llbuild::buildsystem::BuildValue> * __thiscall
llbuild::buildsystem::BuildSystem::build
          (Optional<llbuild::buildsystem::BuildValue> *__return_storage_ptr__,BuildSystem *this,
          BuildKey *key)

{
  BuildSystemImpl *this_00;
  pointer pcVar1;
  long *local_40 [2];
  long local_30 [2];
  
  this_00 = (BuildSystemImpl *)this->impl;
  pcVar1 = (key->key).key._M_dataplus._M_p;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar1,pcVar1 + (key->key).key._M_string_length);
  anon_unknown.dwarf_6d004::BuildSystemImpl::build
            (__return_storage_ptr__,this_00,(BuildKey *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

llvm::Optional<BuildValue> BuildSystem::build(BuildKey key) {
  return static_cast<BuildSystemImpl*>(impl)->build(key);
}